

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void push_output(Context *ctx,Buffer **section)

{
  int iVar1;
  long lVar2;
  
  lVar2 = (long)ctx->output_stack_len;
  if (lVar2 < 3) {
    ctx->output_stack[lVar2] = ctx->output;
    ctx->indent_stack[lVar2] = ctx->indent;
    ctx->output_stack_len = ctx->output_stack_len + 1;
    iVar1 = set_output(ctx,section);
    if (iVar1 != 0) {
      ctx->indent = 0;
    }
    return;
  }
  __assert_fail("ctx->output_stack_len < (int) (STATICARRAYLEN(ctx->output_stack))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x168,"void push_output(Context *, Buffer **)");
}

Assistant:

static void push_output(Context *ctx, Buffer **section)
{
    assert(ctx->output_stack_len < (int) (STATICARRAYLEN(ctx->output_stack)));
    ctx->output_stack[ctx->output_stack_len] = ctx->output;
    ctx->indent_stack[ctx->output_stack_len] = ctx->indent;
    ctx->output_stack_len++;
    if (!set_output(ctx, section))
        return;
    ctx->indent = 0;
}